

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

double ON_SolveNxN(bool bFullPivot,bool bNormalize,int n,double **M,double *B,double *X)

{
  undefined4 uVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  undefined1 *memblock;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  int Xdex_buffer [64];
  undefined1 local_138 [264];
  
  dVar17 = 0.0;
  if ((X != (double *)0x0 && 0 < n) && (B != (double *)0x0 && M != (double **)0x0)) {
    uVar15 = (ulong)(uint)n;
    if (bNormalize) {
      uVar14 = 0;
      do {
        uVar6 = 0;
        dVar17 = 0.0;
        do {
          dVar17 = dVar17 + M[uVar14][uVar6] * M[uVar14][uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar15 != uVar6);
        if (0.0 < dVar17) {
          if (dVar17 < 0.0) {
            dVar17 = sqrt(dVar17);
          }
          else {
            dVar17 = SQRT(dVar17);
          }
          B[uVar14] = B[uVar14] * (1.0 / dVar17);
          pdVar2 = M[uVar14];
          uVar6 = 0;
          do {
            pdVar2[uVar6] = pdVar2[uVar6] * (1.0 / dVar17);
            uVar6 = uVar6 + 1;
          } while (uVar15 != uVar6);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar15);
    }
    if (bFullPivot) {
      if (n < 0x41) {
        memblock = local_138;
      }
      else {
        memblock = (undefined1 *)onmalloc(uVar15 * 4);
      }
      lVar7 = uVar15 - 1;
      auVar18._8_4_ = (int)lVar7;
      auVar18._0_8_ = lVar7;
      auVar18._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar14 = 0;
      auVar18 = auVar18 ^ _DAT_0069b120;
      auVar19 = _DAT_0069b170;
      do {
        auVar22 = auVar19 ^ _DAT_0069b120;
        if ((bool)(~(auVar22._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar22._0_4_ ||
                    auVar18._4_4_ < auVar22._4_4_) & 1)) {
          *(int *)(memblock + uVar14 * 4) = (int)uVar14;
        }
        if ((auVar22._12_4_ != auVar18._12_4_ || auVar22._8_4_ <= auVar18._8_4_) &&
            auVar22._12_4_ <= auVar18._12_4_) {
          *(int *)(memblock + uVar14 * 4 + 4) = (int)uVar14 + 1;
        }
        uVar14 = uVar14 + 2;
        lVar7 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 2;
        auVar19._8_8_ = lVar7 + 2;
      } while ((n + 1U & 0xfffffffe) != uVar14);
    }
    else {
      memblock = (undefined1 *)0x0;
    }
    uVar5 = 1;
    lVar7 = 0;
    dVar23 = 1.0;
    dVar17 = 0.0;
    uVar14 = uVar15;
    uVar6 = 0;
    do {
      uVar11 = uVar6 & 0xffffffff;
      uVar8 = uVar6;
      uVar13 = uVar6;
      dVar20 = 0.0;
      uVar12 = uVar6;
      do {
        dVar21 = ABS(M[uVar13][uVar12]);
        uVar4 = uVar8;
        if (dVar20 < dVar21) {
          uVar11 = uVar13 & 0xffffffff;
          uVar4 = uVar12;
        }
        uVar8 = uVar4 & 0xffffffff;
        if (dVar21 <= dVar20) {
          dVar21 = dVar20;
        }
        uVar13 = uVar13 + 1;
        dVar20 = dVar21;
      } while ((uVar15 != uVar13) ||
              ((bFullPivot && (uVar12 = uVar12 + 1, uVar13 = uVar6, uVar12 < uVar15))));
      if ((dVar21 == 0.0) && (!NAN(dVar21))) {
        if (memblock != local_138 && memblock != (undefined1 *)0x0) {
          onfree(memblock);
        }
        return (double)-(int)uVar6;
      }
      if ((uVar6 == 0) || ((dVar17 <= dVar21 && (dVar20 = dVar17, dVar23 < dVar21)))) {
        dVar23 = dVar21;
      }
      dVar17 = dVar20;
      iVar10 = (int)uVar11;
      if (uVar6 != uVar11) {
        pdVar2 = M[uVar6];
        M[uVar6] = M[iVar10];
        M[iVar10] = pdVar2;
        dVar20 = B[uVar6];
        B[uVar6] = B[iVar10];
        B[iVar10] = dVar20;
      }
      if (uVar6 != (uVar4 & 0xffffffff)) {
        lVar9 = (long)(int)uVar4;
        uVar11 = 0;
        do {
          pdVar2 = M[uVar11];
          dVar20 = pdVar2[uVar6];
          pdVar2[uVar6] = pdVar2[lVar9];
          pdVar2[lVar9] = dVar20;
          uVar11 = uVar11 + 1;
        } while (uVar15 != uVar11);
        uVar1 = *(undefined4 *)(memblock + uVar6 * 4);
        *(undefined4 *)(memblock + uVar6 * 4) = *(undefined4 *)(memblock + lVar9 * 4);
        *(undefined4 *)(memblock + lVar9 * 4) = uVar1;
      }
      pdVar2 = M[uVar6];
      dVar20 = pdVar2[uVar6];
      B[uVar6] = B[uVar6] * (1.0 / dVar20);
      uVar11 = uVar6 + 1;
      if (uVar11 < uVar15) {
        uVar8 = 1;
        do {
          *(double *)((long)pdVar2 + uVar8 * 8 + lVar7) =
               *(double *)((long)pdVar2 + uVar8 * 8 + lVar7) * (1.0 / dVar20);
          uVar8 = uVar8 + 1;
        } while (uVar14 != uVar8);
        uVar8 = uVar5;
        if (uVar11 < uVar15) {
          do {
            pdVar3 = M[uVar8];
            dVar20 = pdVar3[uVar6];
            dVar21 = -dVar20;
            if ((dVar20 != dVar21) || (NAN(dVar20) || NAN(dVar21))) {
              B[uVar8] = B[uVar6] * dVar21 + B[uVar8];
              uVar13 = 1;
              do {
                *(double *)((long)pdVar3 + uVar13 * 8 + lVar7) =
                     *(double *)((long)pdVar2 + uVar13 * 8 + lVar7) * dVar21 +
                     *(double *)((long)pdVar3 + uVar13 * 8 + lVar7);
                uVar13 = uVar13 + 1;
              } while (uVar14 != uVar13);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar15);
        }
      }
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 8;
      uVar14 = uVar14 - 1;
      uVar6 = uVar11;
    } while (uVar11 != uVar15);
    uVar6 = (ulong)(n - 1);
    uVar14 = uVar15;
    do {
      if (uVar14 < 2) break;
      uVar5 = uVar14 - 1;
      uVar11 = 0;
      do {
        dVar20 = M[uVar11][uVar5];
        if ((dVar20 != 0.0) || (NAN(dVar20))) {
          B[uVar11] = B[uVar11] - dVar20 * B[uVar5];
        }
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
      uVar6 = uVar6 - 1;
      bVar16 = 1 < uVar14;
      uVar14 = uVar5;
    } while (bVar16);
    if (bFullPivot) {
      uVar14 = 0;
      do {
        X[*(int *)(memblock + uVar14 * 4)] = B[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
      if (memblock != local_138) {
        onfree(memblock);
      }
    }
    else {
      memcpy(X,B,uVar15 << 3);
    }
    dVar17 = dVar17 / dVar23;
  }
  return dVar17;
}

Assistant:

double ON_SolveNxN(bool bFullPivot, bool bNormalize, int n, double* M[], double B[], double X[])
{
  if ( n <= 0 || 0 == M || 0 == B || 0 == X )
    return 0.0;

  int i,j,maxi,maxj,n0, Xdex_buffer[64];
  double x,minpivot=0.0,maxpivot=1.0,*p;
  int* Xdex = 0;
  
  if ( bNormalize )
  {
    for ( i = 0; i < n; i++ )
    {
      x = 0.0;
      for ( j = 0; j < n; j++ )
      {
        x += M[i][j]*M[i][j];
      }
      if ( x > 0.0 )
      {
        x = 1.0/sqrt(x);
        B[i] *= x;
        for ( j = 0; j < n; j++ )
          M[i][j] *= x;
      }
    }
  }

  if ( bFullPivot )
  {
    // The Xdex_buffer[] hoo haa is here to avoid an potentially time
    // consuming call to heap services when the matrix is small.
    // When n > 64 the numerical portion of the computation is 
    // long enough that the time to call onmalloc() is negligible.
    // (When n > 10-ish, this calculation is likely to return junk
    // unless you have a special case matrix, in which case this
    // function will be much slower than one that is designed to
    // takes advantage of the special case.
    Xdex = (n <= (int)((sizeof(Xdex_buffer)/sizeof(Xdex_buffer[0]))))
         ? &Xdex_buffer[0] 
         : (int*)onmalloc(n*sizeof(Xdex[0]));
    for ( i = 0; i < n; i++ )
      Xdex[i] = i;
  }

  // reduce system of equations to upper triangular
  for (n0=0; n0<n; n0++)
  {
    // find pivot = biggest entry in sub-matrix
    maxi=n0;
    maxj=n0;
    x=0.0;
    for(j=n0;j<n;j++) 
    {
      for(i=n0;i<n;i++)  
      {
        if ( fabs(M[i][j]) > x )
        {
          x=fabs(M[i][j]);
          maxi=i;
          maxj=j;
        }
      }
      if ( !bFullPivot )
        break;
    }
    if ( 0.0==x )
    {
      // system of equations is degenerate
      // Return -(rank of M) (M has rank n0)
      if ( 0 != Xdex && Xdex != &Xdex_buffer[0] )
        onfree(Xdex);
      return -n0;
    }
    else if ( 0==n0 )
    {
      minpivot=x;
      maxpivot=x;
    }
    else if (x < minpivot)
      minpivot=x;
    else if  (x > maxpivot)
      maxpivot=x;

    // put pivot in M[n0][n0]
    if ( n0 != maxi )
    {
      // swap rows n0 and maxi
      p = M[n0];M[n0]=M[maxi];M[maxi]=p;
      x=B[n0];B[n0]=B[maxi];B[maxi]=x;
    }
    if ( n0 != maxj )
    {
      // swap columns n0 and maxj
      for (i=0;i<n;i++)
      {
        x=M[i][n0];M[i][n0]=M[i][maxj];M[i][maxj]=x;
      }
      j=Xdex[n0];Xdex[n0]=Xdex[maxj];Xdex[maxj]=j;
    }

    // divide row n0 by M[n0][n0] to unitize M[n0][n0]
    x = 1.0/M[n0][n0];
    //M[n0][n0] = 1.0; // cosmetic because M[n0][n0] will never be used again
    B[n0] *= x;
    for (j=n0+1;j<n;j++) 
      M[n0][j] *= x;

    // For each i > n0, replace row[i] with
    // row[i] - M[i][n0]*row[n0] to zero out M[i>n0][n0]
    for ( i = n0+1; i < n; i++ )
    {
      x = -M[i][n0];
      if ( 0.0 != x )
      {
        //M[i][n0] = 0.0; // cosmetic because M[i][n0] will never be used again
        B[i] += x*B[n0];
        for ( j = n0+1; j < n; j++ )
        {
          M[i][j] += x*M[n0][j];
        }
      }
    }
  }

  // At this point M is upper triangular with 1's
  // on its diagonal.  Backsolve.
  for ( j = n-1; j >= 0; j-- )
  {
    for ( i = 0; i < j; i++ )
    {
      x = -M[i][j];
      if ( x != 0 )
      {
        B[i] += x*B[j];
        //M[i][j] += x; // cosmetic because M[i][j] will never be used again
      }
    }
  }

  // solution is now in B
  if ( bFullPivot )
  {
    for(i=0;i<n;i++)
      X[Xdex[i]] = B[i];

    if ( 0 != Xdex && Xdex != &Xdex_buffer[0] )
      onfree(Xdex);
  }
  else
  {
    memcpy(&X[0],&B[0],n*sizeof(X[0]));
  }

  return minpivot/maxpivot;
}